

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystemCommand.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_2c0f7::ParseBuildFileDelegate::cannotLoadDueToMultipleProducers
          (ParseBuildFileDelegate *this,Node *output,
          vector<llbuild::buildsystem::Command_*,_std::allocator<llbuild::buildsystem::Command_*>_>
          *commands)

{
  reference ppCVar1;
  Twine local_150;
  undefined8 local_138;
  undefined4 local_130;
  char *local_128;
  size_t local_120;
  __normal_iterator<llbuild::buildsystem::Command_**,_std::vector<llbuild::buildsystem::Command_*,_std::allocator<llbuild::buildsystem::Command_*>_>_>
  local_118;
  StringRef local_110;
  string local_100;
  StringRef local_e0;
  string local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  undefined1 local_50 [8];
  string message;
  vector<llbuild::buildsystem::Command_*,_std::allocator<llbuild::buildsystem::Command_*>_>
  *commands_local;
  Node *output_local;
  ParseBuildFileDelegate *this_local;
  
  message.field_2._8_8_ = commands;
  local_e0 = llbuild::buildsystem::Node::getName(output);
  llvm::StringRef::str_abi_cxx11_(&local_d0,&local_e0);
  std::operator+(&local_b0,"cannot build \'",&local_d0);
  std::operator+(&local_90,&local_b0,"\' node is produced by multiple commands; e.g. \'");
  local_118._M_current =
       (Command **)
       std::
       vector<llbuild::buildsystem::Command_*,_std::allocator<llbuild::buildsystem::Command_*>_>::
       begin(commands);
  ppCVar1 = __gnu_cxx::
            __normal_iterator<llbuild::buildsystem::Command_**,_std::vector<llbuild::buildsystem::Command_*,_std::allocator<llbuild::buildsystem::Command_*>_>_>
            ::operator*(&local_118);
  local_110 = llbuild::buildsystem::Command::getName(*ppCVar1);
  llvm::StringRef::str_abi_cxx11_(&local_100,&local_110);
  std::operator+(&local_70,&local_90,&local_100);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50,
                 &local_70,"\'");
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_100);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::~string((string *)&local_d0);
  local_128 = "";
  local_120 = strlen("");
  local_138 = 0;
  local_130 = 0;
  llvm::Twine::Twine(&local_150,(string *)local_50);
  (*(this->super_BuildFileDelegate)._vptr_BuildFileDelegate[5])
            (this,local_128,local_120,&local_138,&local_150);
  std::__cxx11::string::~string((string *)local_50);
  return;
}

Assistant:

void
ParseBuildFileDelegate::cannotLoadDueToMultipleProducers(Node *output,
                                                         std::vector<Command*> commands) {
  std::string message = "cannot build '" + output->getName().str() + "' node is produced "
  "by multiple commands; e.g. '" + (*commands.begin())->getName().str() + "'";
  error("", {}, message);
}